

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

bool cmFileSetVisibilityIsForInterface(cmFileSetVisibility vis)

{
  undefined1 local_9;
  cmFileSetVisibility vis_local;
  
  if (vis == Private) {
    local_9 = false;
  }
  else if (vis == Public || vis == Interface) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool cmFileSetVisibilityIsForInterface(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
    case cmFileSetVisibility::Public:
      return true;
    case cmFileSetVisibility::Private:
      return false;
  }
  return false;
}